

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.h
# Opt level: O2

bool __thiscall QLineEditPrivate::shouldShowPlaceholderText(QLineEditPrivate *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QWidgetLineControl::text((QString *)&local_30,(QWidgetLineControl *)this->control);
  if (local_30.size == 0) {
    QTextLayout::preeditAreaText();
    if (QStack_48.size == 0) {
      bVar1 = true;
      if ((this->alignment & 4) != 0) {
        bVar1 = QWidget::hasFocus(*(QWidget **)&(this->super_QWidgetPrivate).field_0x8);
        bVar1 = !bVar1;
      }
    }
    else {
      bVar1 = false;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  }
  else {
    bVar1 = false;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

inline bool shouldShowPlaceholderText() const
    {
        return control->text().isEmpty() && control->preeditAreaText().isEmpty()
                && !((alignment & Qt::AlignHCenter) && q_func()->hasFocus());
    }